

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmArea.c
# Opt level: O2

Vec_Int_t * Abc_NtkPrecomputeFirsts(Mio_Cell2_t *pCells,int nCells)

{
  int *piVar1;
  Vec_Int_t *p;
  long lVar2;
  int Entry;
  uint *puVar3;
  
  p = Vec_IntAlloc(2);
  p->nSize = 2;
  piVar1 = p->pArray;
  if (piVar1 != (int *)0x0) {
    piVar1[0] = -1;
    piVar1[1] = -1;
  }
  puVar3 = (uint *)&pCells[2].field_0x10;
  Entry = 0;
  for (lVar2 = 2; lVar2 < nCells; lVar2 = lVar2 + 1) {
    Vec_IntPush(p,Entry);
    Entry = Entry + (*puVar3 >> 0x1c) * 3 + 3;
    puVar3 = puVar3 + 0x14;
  }
  if (p->nSize == nCells) {
    return p;
  }
  __assert_fail("nCells == Vec_IntSize(vFirst)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmArea.c"
                ,0x84,"Vec_Int_t *Abc_NtkPrecomputeFirsts(Mio_Cell2_t *, int)");
}

Assistant:

Vec_Int_t * Abc_NtkPrecomputeFirsts( Mio_Cell2_t * pCells, int nCells )
{
    int i, Index = 0;
    Vec_Int_t * vFirst = Vec_IntStartFull( 2 ); 
    for ( i = 2; i < nCells; i++ )
    {
        Vec_IntPush( vFirst, Index );
        Index += 3 * (pCells[i].nFanins + 1);
    }
    assert( nCells == Vec_IntSize(vFirst) );
    return vFirst;
}